

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
               (CodedInputStream *input,int64_t *value)

{
  bool bVar1;
  uint64_t temp;
  ulong local_10;
  
  bVar1 = io::CodedInputStream::ReadVarint64(input,&local_10);
  if (bVar1) {
    *value = -(ulong)((uint)local_10 & 1) ^ local_10 >> 1;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int64_t, WireFormatLite::TYPE_SINT64>(
    io::CodedInputStream* input, int64_t* value) {
  uint64_t temp;
  if (!input->ReadVarint64(&temp)) return false;
  *value = ZigZagDecode64(temp);
  return true;
}